

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BinOpr expr_binop(LexState *ls,ExpDesc *v,uint32_t limit)

{
  bool bVar1;
  BinOpr BVar2;
  undefined1 local_38 [4];
  BinOpr nextop;
  ExpDesc v2;
  BinOpr op;
  uint32_t limit_local;
  ExpDesc *v_local;
  LexState *ls_local;
  
  v2._20_4_ = limit;
  synlevel_begin(ls);
  expr_unop(ls,v);
  v2.f = token2binop(ls->tok);
  while( true ) {
    bVar1 = false;
    if (v2.f != 0xf) {
      bVar1 = (uint)v2._20_4_ < (uint)priority[v2.f].left;
    }
    if (!bVar1) break;
    lj_lex_next(ls);
    bcemit_binop_left(ls->fs,v2.f,v);
    BVar2 = expr_binop(ls,(ExpDesc *)local_38,(uint)priority[v2.f].right);
    bcemit_binop(ls->fs,v2.f,v,(ExpDesc *)local_38);
    v2.f = BVar2;
  }
  ls->level = ls->level - 1;
  return v2.f;
}

Assistant:

static BinOpr expr_binop(LexState *ls, ExpDesc *v, uint32_t limit)
{
  BinOpr op;
  synlevel_begin(ls);
  expr_unop(ls, v);
  op = token2binop(ls->tok);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    ExpDesc v2;
    BinOpr nextop;
    lj_lex_next(ls);
    bcemit_binop_left(ls->fs, op, v);
    /* Parse binary expression with higher priority. */
    nextop = expr_binop(ls, &v2, priority[op].right);
    bcemit_binop(ls->fs, op, v, &v2);
    op = nextop;
  }
  synlevel_end(ls);
  return op;  /* Return unconsumed binary operator (if any). */
}